

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O0

void add_page(QPDFPageDocumentHelper *dh,QPDFObjectHandle *font,string *color_space,string *filter)

{
  QPDFPageObjectHelper QVar1;
  string *psVar2;
  ImageProvider *this;
  QPDFObjectHandle *this_00;
  allocator<char> *__a;
  allocator<char> *__a_00;
  string *text;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __a_01;
  QPDFObjectHandle local_398;
  QPDFPageObjectHelper local_388;
  allocator<char> local_349;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [32];
  QPDFObjectHandle local_300;
  undefined1 local_2f0 [8];
  QPDFObjectHandle page;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  QPDFObjectHandle contents;
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  undefined1 local_218 [8];
  QPDFObjectHandle resources;
  string local_200 [32];
  undefined1 local_1e0 [8];
  QPDFObjectHandle xobject;
  string local_1c8 [32];
  undefined1 local_1a8 [8];
  QPDFObjectHandle rfont;
  QPDFObjectHandle procset;
  allocator<char> local_171;
  string local_170 [32];
  QPDFObjectHandle local_150;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_140;
  QPDFObjectHandle local_130;
  allocator<char> local_119;
  string local_118 [32];
  QPDFObjectHandle local_f8;
  allocator<char> local_e1;
  string local_e0 [32];
  undefined1 local_c0 [24];
  string local_a8 [32];
  undefined1 local_88 [8];
  QPDFObjectHandle image_dict;
  QPDFObjectHandle image;
  size_t height;
  size_t width;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> provider;
  ImageProvider *p;
  QPDF *pdf;
  string *filter_local;
  string *color_space_local;
  QPDFObjectHandle *font_local;
  QPDFPageDocumentHelper *dh_local;
  
  psVar2 = (string *)QPDFDocumentHelper::getQPDF(&dh->super_QPDFDocumentHelper);
  this = (ImageProvider *)operator_new(0x88);
  ImageProvider::ImageProvider(this,color_space,filter);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr<ImageProvider,void>
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&width,this);
  ImageProvider::getWidth(this);
  ImageProvider::getHeight(this);
  QPDF::newStream();
  operator____qpdf(local_88,0x115092);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"/ColorSpace",(allocator<char> *)(local_c0 + 0x17));
  newName((string *)local_c0);
  QPDFObjectHandle::replaceKey((string *)local_88,(QPDFObjectHandle *)local_a8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"/Width",&local_e1);
  newInteger((size_t)&local_f8);
  QPDFObjectHandle::replaceKey((string *)local_88,(QPDFObjectHandle *)local_e0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"/Height",&local_119);
  newInteger((size_t)&local_130);
  QPDFObjectHandle::replaceKey((string *)local_88,(QPDFObjectHandle *)local_118);
  QPDFObjectHandle::~QPDFObjectHandle(&local_130);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  QPDFObjectHandle::replaceDict
            ((QPDFObjectHandle *)
             &image_dict.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
            (&local_140,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&width);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"",&local_171);
  QPDFObjectHandle::parse((string *)&local_150,(string *)filter);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData
            (&image_dict.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_140,
             &local_150,
             &procset.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &procset.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle(&local_150);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_140);
  operator____qpdf((char *)&rfont.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   0x1150e5);
  QPDFObjectHandle::newDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c8,"/F1",
             (allocator<char> *)
             ((long)&xobject.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::replaceKey((string *)local_1a8,(QPDFObjectHandle *)local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&xobject.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::newDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,"/Im1",
             (allocator<char> *)
             ((long)&resources.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::replaceKey((string *)local_1e0,(QPDFObjectHandle *)local_200);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&resources.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::newDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"/ProcSet",&local_239);
  QPDFObjectHandle::replaceKey((string *)local_218,(QPDFObjectHandle *)local_238);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_260,"/Font",&local_261);
  QPDFObjectHandle::replaceKey((string *)local_218,(QPDFObjectHandle *)local_260);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  __a_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&contents.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffd78,"/XObject",(allocator<char> *)__a_01._M_pi);
  QPDFObjectHandle::replaceKey((string *)local_218,(QPDFObjectHandle *)&stack0xfffffffffffffd78);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&contents.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  text = psVar2;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &page.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,color_space
                 ," with filter ");
  std::operator+(&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &page.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,filter);
  createPageContents((QPDF *)local_2a0,text);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string
            ((string *)
             &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  operator____qpdf((char *)&local_300,0x115129);
  QPDF::makeIndirectObject((QPDFObjectHandle *)local_2f0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_300);
  __a_00 = &local_321;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"/Contents",__a_00);
  QPDFObjectHandle::replaceKey((string *)local_2f0,(QPDFObjectHandle *)local_320);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  __a = &local_349;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_348,"/Resources",__a);
  QPDFObjectHandle::replaceKey((string *)local_2f0,(QPDFObjectHandle *)local_348);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  this_00 = &local_398;
  QPDFObjectHandle::QPDFObjectHandle(this_00,(QPDFObjectHandle *)local_2f0);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_388,(QPDFObjectHandle *)this_00);
  QVar1._8_8_ = this_00;
  QVar1._0_8_ = dh;
  QVar1._16_8_ = __a;
  QVar1._24_8_ = __a_00;
  QVar1._32_8_ = psVar2;
  QVar1.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)text;
  QVar1.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = __a_01._M_pi;
  QPDFPageDocumentHelper::addPage(QVar1,SUB81(dh,0));
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_388);
  QPDFObjectHandle::~QPDFObjectHandle(&local_398);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2f0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2a0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_218);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1e0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1a8);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &rfont.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_88);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &image_dict.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&width);
  return;
}

Assistant:

void
add_page(
    QPDFPageDocumentHelper& dh,
    QPDFObjectHandle font,
    std::string const& color_space,
    std::string const& filter)
{
    QPDF& pdf(dh.getQPDF());

    // Create a stream to encode our image. QPDFWriter will fill in the length and will respect our
    // filters based on stream data mode. Since we are not specifying, QPDFWriter will compress with
    // /FlateDecode if we don't provide any other form of compression.
    auto* p = new ImageProvider(color_space, filter);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> provider(p);
    size_t width = p->getWidth();
    size_t height = p->getHeight();
    QPDFObjectHandle image = pdf.newStream();
    auto image_dict =
        // line-break
        "<<"
        " /Type /XObject"
        " /Subtype /Image"
        " /BitsPerComponent 8"
        ">>"_qpdf;
    image_dict.replaceKey("/ColorSpace", newName(color_space));
    image_dict.replaceKey("/Width", newInteger(width));
    image_dict.replaceKey("/Height", newInteger(height));
    image.replaceDict(image_dict);

    // Provide the stream data.
    image.replaceStreamData(provider, QPDFObjectHandle::parse(filter), QPDFObjectHandle::newNull());

    // Create direct objects as needed by the page dictionary.
    QPDFObjectHandle procset = "[/PDF /Text /ImageC]"_qpdf;

    QPDFObjectHandle rfont = QPDFObjectHandle::newDictionary();
    rfont.replaceKey("/F1", font);

    QPDFObjectHandle xobject = QPDFObjectHandle::newDictionary();
    xobject.replaceKey("/Im1", image);

    QPDFObjectHandle resources = QPDFObjectHandle::newDictionary();
    resources.replaceKey("/ProcSet", procset);
    resources.replaceKey("/Font", rfont);
    resources.replaceKey("/XObject", xobject);

    // Create the page content stream
    QPDFObjectHandle contents = createPageContents(pdf, color_space + " with filter " + filter);

    // Create the page dictionary
    QPDFObjectHandle page = pdf.makeIndirectObject(
        "<<"
        " /Type /Page"
        " /MediaBox [0 0 612 392]"
        ">>"_qpdf);
    page.replaceKey("/Contents", contents);
    page.replaceKey("/Resources", resources);

    // Add the page to the PDF file
    dh.addPage(page, false);
}